

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnviewgrip.cpp
# Opt level: O1

int __thiscall QColumnViewGrip::moveGrip(QColumnViewGrip *this,int offset)

{
  int iVar1;
  QWidget *this_00;
  LayoutDirection LVar2;
  int iVar3;
  QSize QVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  int local_4c;
  QSize local_48;
  int *piStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)(*(long *)(this + 8) + 0x10);
  iVar6 = (this_00->data->crect).x2.m_i - (this_00->data->crect).x1.m_i;
  LVar2 = QWidget::layoutDirection((QWidget *)this);
  iVar5 = -offset;
  if (LVar2 != RightToLeft) {
    iVar5 = offset;
  }
  iVar5 = iVar5 + iVar6 + 1;
  QVar4 = QWidget::minimumSize(this_00);
  local_48.wd.m_i = QVar4.wd.m_i.m_i;
  if (QVar4.wd.m_i.m_i < iVar5) {
    local_48.wd.m_i = iVar5;
  }
  local_48.ht.m_i = ((this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i) + 1;
  QWidget::resize(this_00,&local_48);
  iVar5 = (this_00->data->crect).x2.m_i;
  iVar1 = (this_00->data->crect).x1.m_i;
  iVar3 = QWidget::x(this_00);
  iVar5 = (iVar5 - (iVar6 + 1 + iVar1)) + 1;
  if (iVar5 != 0) {
    piStack_40 = &local_4c;
    local_48.wd.m_i = 0;
    local_48.ht.m_i = 0;
    local_4c = iVar5;
    QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)&local_48);
  }
  LVar2 = QWidget::layoutDirection((QWidget *)this);
  if (LVar2 == RightToLeft) {
    iVar5 = QWidget::x(this_00);
    iVar5 = iVar5 - iVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int QColumnViewGrip::moveGrip(int offset)
{
    QWidget *parentWidget = (QWidget*)parent();

    // first resize the parent
    int oldWidth = parentWidget->width();
    int newWidth = oldWidth;
    if (isRightToLeft())
       newWidth -= offset;
    else
       newWidth += offset;
    newWidth = qMax(parentWidget->minimumWidth(), newWidth);
    parentWidget->resize(newWidth, parentWidget->height());

    // Then have the view move the widget
    int realOffset = parentWidget->width() - oldWidth;
    int oldX = parentWidget->x();
    if (realOffset != 0)
        emit gripMoved(realOffset);
    if (isRightToLeft())
        realOffset = -1 * (oldX - parentWidget->x());
    return realOffset;
}